

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result * __thiscall
testing::internal::FunctionMocker<ot::commissioner::Error_()>::PerformDefaultAction
          (Result *__return_storage_ptr__,FunctionMocker<ot::commissioner::Error_()> *this,
          ArgumentTuple *args,string *call_description)

{
  OnCallSpec<ot::commissioner::Error_()> *this_00;
  long *plVar1;
  pointer pcVar2;
  char cVar3;
  Action<ot::commissioner::Error_()> *pAVar4;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  undefined **local_50;
  undefined8 local_48;
  undefined *local_40 [2];
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar5 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<ot::commissioner::Error_()> *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    local_48 = 0;
    local_50 = &PTR__MatchResultListener_002da950;
    plVar1 = *(long **)(this_00 + 0x20);
    cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,args,&local_50);
    if (cVar3 != '\0') {
      pAVar4 = OnCallSpec<ot::commissioner::Error_()>::GetAction(this_00);
      Action<ot::commissioner::Error_()>::Perform(__return_storage_ptr__,pAVar4);
      return __return_storage_ptr__;
    }
  }
  pcVar2 = (call_description->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)&local_50);
  if (DefaultValue<ot::commissioner::Error>::producer_ == (long *)0x0) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    (**(code **)(*DefaultValue<ot::commissioner::Error>::producer_ + 0x10))(__return_storage_ptr__);
  }
  if (local_50 == local_40) {
    return __return_storage_ptr__;
  }
  operator_delete(local_50);
  return __return_storage_ptr__;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }